

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adksys_procfs.c
# Opt level: O0

int adksys_starttime(timeval *tv)

{
  int iVar1;
  undefined1 local_a8 [4];
  int result;
  stat buf;
  timeval *tv_local;
  
  tv->tv_usec = 0;
  tv->tv_sec = 0;
  buf.__glibc_reserved[2] = (__syscall_slong_t)tv;
  iVar1 = stat("/proc/self",(stat *)local_a8);
  if (iVar1 == -1) {
    tv_local._4_4_ = -1;
  }
  else {
    *(__syscall_slong_t *)buf.__glibc_reserved[2] = buf.st_atim.tv_nsec;
    *(long *)(buf.__glibc_reserved[2] + 8) = buf.st_mtim.tv_sec / 1000;
    tv_local._4_4_ = 0;
  }
  return tv_local._4_4_;
}

Assistant:

int adksys_starttime(struct timeval *tv)
{
   struct stat buf;
   int result;
   tv->tv_sec = tv->tv_usec = 0;
   result = stat("/proc/self", &buf);
   if (result == -1)
      return -1;

   tv->tv_sec = buf.st_mtime;
   tv->tv_usec = buf.st_mtim.tv_nsec / 1000;
   return 0;
}